

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/test-util.c++:1192:13)>
::destroy(SimpleTransformPromiseNode<kj::Maybe<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1192:13)>
          *this)

{
  SimpleTransformPromiseNode<kj::Maybe<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1192:13)>
  *this_local;
  
  freePromise<kj::_::SimpleTransformPromiseNode<kj::Maybe<int>,capnp::_::TestMoreStuffImpl::writeToFd(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::WriteToFdParams,capnproto_test::capnp::test::TestMoreStuff::WriteToFdResults>)::__1>>
            (this);
  return;
}

Assistant:

void destroy() override {
    freePromise(this);
  }